

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,_152>::Type
          (Type<2,_152> *this,int zaid,double awr,bool lssf,int interpolation,double temperature,
          vector<double,_std::allocator<double>_> *dilutions,
          vector<double,_std::allocator<double>_> *energies,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *total,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *elastic,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *fission,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *capture,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *cwTotal)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  double local_88;
  double local_80;
  ListRecord local_78;
  
  pdVar1 = (dilutions->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (dilutions->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_88 = temperature;
  local_80 = awr;
  generateList((vector<double,_std::allocator<double>_> *)&local_a8,dilutions,energies,total,elastic
               ,fission,capture,cwTotal);
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)((long)pdVar4 - (long)pdVar3 >> 3);
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)pdVar2 - (long)pdVar1 >> 3;
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3;
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 5
  ;
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 0.0;
  local_78.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = local_88;
  local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_a8._M_impl.super__Vector_impl_data._M_start;
  local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_a8._M_impl.super__Vector_impl_data._M_finish;
  local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Type(this,zaid,local_80,lssf,interpolation,&local_78);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_78.data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

Type( int zaid, double awr, bool lssf, int interpolation, double temperature,
      std::vector< double >&& dilutions, std::vector< double >&& energies,
      std::vector< std::vector< double > >&& total,
      std::vector< std::vector< double > >&& elastic,
      std::vector< std::vector< double > >&& fission,
      std::vector< std::vector< double > >&& capture,
      std::vector< std::vector< double > >&& cwTotal )
  try : Type( zaid, awr, lssf, interpolation,
              ListRecord( temperature, 0., 5, dilutions.size(), energies.size(),
                          generateList( std::move( dilutions ),
                                        std::move( energies ),
                                        std::move( total ),
                                        std::move( elastic ),
                                        std::move( fission ),
                                        std::move( capture ),
                                        std::move( cwTotal ) ) ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Trouble while constructing section 152 of File 2" );
    throw e;
  }